

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall
phosg::Image::custom_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
          *per_pixel_fn)

{
  bool bVar1;
  bool bVar2;
  long y_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  uint64_t db;
  uint64_t dg;
  uint64_t dr;
  uint64_t sa;
  uint64_t sb;
  uint64_t sr;
  uint64_t da;
  uint64_t sg;
  long local_c8;
  uint64_t local_b0;
  uint64_t local_a8;
  uint64_t local_a0;
  unsigned_long local_98;
  unsigned_long local_90;
  unsigned_long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  ulong local_60;
  Image *local_58;
  long local_50;
  ssize_t local_48;
  uint64_t local_40;
  unsigned_long local_38;
  
  lVar7 = source->width;
  lVar8 = source->height;
  if (w < 0) {
    w = lVar7;
  }
  if (h < 0) {
    h = lVar8;
  }
  uVar4 = sx >> 0x3f & sx;
  local_70 = x - uVar4;
  lVar3 = 0;
  if (sx < 1) {
    sx = lVar3;
  }
  uVar5 = sy >> 0x3f & sy;
  local_68 = y - uVar5;
  if (sy < 1) {
    sy = lVar3;
  }
  local_78 = 0;
  if (0 < local_70) {
    local_78 = local_70;
  }
  if (-1 < local_70) {
    local_70 = lVar3;
  }
  uVar4 = uVar4 + w + local_70;
  local_70 = sx - local_70;
  local_80 = 0;
  if (0 < local_68) {
    local_80 = local_68;
  }
  if (-1 < local_68) {
    local_68 = lVar3;
  }
  uVar6 = uVar5 + h + local_68;
  local_68 = sy - local_68;
  uVar5 = lVar7 - local_70;
  if ((long)(uVar4 + local_70) <= lVar7) {
    uVar5 = uVar4;
  }
  uVar4 = lVar8 - local_68;
  if ((long)(uVar6 + local_68) <= lVar8) {
    uVar4 = uVar6;
  }
  local_60 = this->width - local_78;
  if ((long)(uVar5 + local_78) <= this->width) {
    local_60 = uVar5;
  }
  uVar5 = this->height - local_80;
  if ((long)(uVar4 + local_80) <= this->height) {
    uVar5 = uVar4;
  }
  bVar9 = -1 < (long)(local_60 | uVar5);
  if ((bVar9) && (0 < (long)uVar5)) {
    bVar1 = 0 < (long)local_60;
    local_c8 = 0;
    local_58 = this;
    do {
      if (bVar1 && -1 < (long)uVar5) {
        local_48 = local_68 + local_c8;
        local_50 = local_80 + local_c8;
        lVar3 = 1;
        lVar7 = local_70;
        lVar8 = local_78;
        do {
          read_pixel(source,lVar7,local_48,&local_88,&local_38,&local_90,&local_98);
          y_00 = local_50;
          read_pixel(this,lVar8,local_50,&local_a0,&local_a8,&local_b0,&local_40);
          ::std::
          function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
          ::operator()(per_pixel_fn,&local_a0,&local_a8,&local_b0,&local_40,local_88,local_38,
                       local_90,local_98);
          write_pixel(this,lVar8,y_00,local_a0,local_a8,local_b0,local_40);
          bVar2 = lVar3 < (long)local_60;
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 1;
          lVar3 = lVar3 + 1;
        } while (bVar9 && bVar2);
      }
      local_c8 = local_c8 + 1;
    } while (bVar9 && local_c8 < (long)uVar5);
  }
  return;
}

Assistant:

void Image::custom_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy,
    function<void(uint64_t&, uint64_t&, uint64_t&, uint64_t&, uint64_t, uint64_t, uint64_t, uint64_t)> per_pixel_fn) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t sr, sg, sb, sa, dr, dg, db, da;
      source.read_pixel(sx + xx, sy + yy, &sr, &sg, &sb, &sa);
      this->read_pixel(x + xx, y + yy, &dr, &dg, &db, &da);

      per_pixel_fn(dr, dg, db, da, sr, sg, sb, sa);

      this->write_pixel(x + xx, y + yy, dr, dg, db, da);
    }
  }
}